

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O3

DdNode * Extra_bddSpaceEquationsPos(DdManager *dd,DdNode *bSpace)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraBddSpaceEquationsPos(dd,bSpace);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_bddSpaceEquationsPos( DdManager * dd, DdNode * bSpace )
{
    DdNode * zRes;
    do {
        dd->reordered = 0;
        zRes = extraBddSpaceEquationsPos( dd, bSpace );
    } while (dd->reordered == 1);
    return zRes;
}